

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlReadFile(char *filename,char *encoding,int options)

{
  xmlParserCtxtPtr ctxt_00;
  xmlDocPtr local_40;
  xmlDocPtr doc;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *filename_local;
  
  local_40 = (xmlDocPtr)0x0;
  ctxt_00 = xmlNewParserCtxt();
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    xmlCtxtUseOptions(ctxt_00,options | 0x1000000);
    if (((filename == (char *)0x0) || (*filename != '-')) || (filename[1] != '\0')) {
      doc = (xmlDocPtr)xmlCtxtNewInputFromUrl(ctxt_00,filename,(char *)0x0,encoding,0);
    }
    else {
      doc = (xmlDocPtr)xmlCtxtNewInputFromFd(ctxt_00,filename,0,encoding,0);
    }
    if (doc != (xmlDocPtr)0x0) {
      local_40 = xmlCtxtParseDocument(ctxt_00,(xmlParserInputPtr)doc);
    }
    xmlFreeParserCtxt(ctxt_00);
    filename_local = (char *)local_40;
  }
  return (xmlDocPtr)filename_local;
}

Assistant:

xmlDocPtr
xmlReadFile(const char *filename, const char *encoding, int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlDocPtr doc = NULL;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
        return(NULL);

    options |= XML_PARSE_UNZIP;

    xmlCtxtUseOptions(ctxt, options);

    /*
     * Backward compatibility for users of command line utilities like
     * xmlstarlet expecting "-" to mean stdin. This is dangerous and
     * should be removed at some point.
     */
    if ((filename != NULL) && (filename[0] == '-') && (filename[1] == 0))
        input = xmlCtxtNewInputFromFd(ctxt, filename, STDIN_FILENO,
                                      encoding, 0);
    else
        input = xmlCtxtNewInputFromUrl(ctxt, filename, NULL, encoding, 0);

    if (input != NULL)
        doc = xmlCtxtParseDocument(ctxt, input);

    xmlFreeParserCtxt(ctxt);
    return(doc);
}